

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathAxisVal xmlXPathIsAxisName(xmlChar *name)

{
  int iVar1;
  xmlXPathAxisVal local_14;
  xmlXPathAxisVal ret;
  xmlChar *name_local;
  
  local_14 = 0;
  switch(*name) {
  case 'a':
    iVar1 = xmlStrEqual(name,(xmlChar *)"ancestor");
    local_14 = (xmlXPathAxisVal)(iVar1 != 0);
    iVar1 = xmlStrEqual(name,(xmlChar *)"ancestor-or-self");
    if (iVar1 != 0) {
      local_14 = AXIS_ANCESTOR_OR_SELF;
    }
    iVar1 = xmlStrEqual(name,"attribute");
    if (iVar1 != 0) {
      local_14 = AXIS_ATTRIBUTE;
    }
    break;
  case 'c':
    iVar1 = xmlStrEqual(name,"child");
    if (iVar1 != 0) {
      local_14 = AXIS_CHILD;
    }
    break;
  case 'd':
    iVar1 = xmlStrEqual(name,(xmlChar *)"descendant");
    if (iVar1 != 0) {
      local_14 = AXIS_DESCENDANT;
    }
    iVar1 = xmlStrEqual(name,(xmlChar *)"descendant-or-self");
    if (iVar1 != 0) {
      local_14 = AXIS_DESCENDANT_OR_SELF;
    }
    break;
  case 'f':
    iVar1 = xmlStrEqual(name,(xmlChar *)"following");
    if (iVar1 != 0) {
      local_14 = AXIS_FOLLOWING;
    }
    iVar1 = xmlStrEqual(name,(xmlChar *)"following-sibling");
    if (iVar1 != 0) {
      local_14 = AXIS_FOLLOWING_SIBLING;
    }
    break;
  case 'n':
    iVar1 = xmlStrEqual(name,"namespace");
    if (iVar1 != 0) {
      local_14 = AXIS_NAMESPACE;
    }
    break;
  case 'p':
    iVar1 = xmlStrEqual(name,(xmlChar *)"parent");
    if (iVar1 != 0) {
      local_14 = AXIS_PARENT;
    }
    iVar1 = xmlStrEqual(name,(xmlChar *)"preceding");
    if (iVar1 != 0) {
      local_14 = AXIS_PRECEDING;
    }
    iVar1 = xmlStrEqual(name,(xmlChar *)"preceding-sibling");
    if (iVar1 != 0) {
      local_14 = AXIS_PRECEDING_SIBLING;
    }
    break;
  case 's':
    iVar1 = xmlStrEqual(name,"self");
    if (iVar1 != 0) {
      local_14 = AXIS_SELF;
    }
  }
  return local_14;
}

Assistant:

static xmlXPathAxisVal
xmlXPathIsAxisName(const xmlChar *name) {
    xmlXPathAxisVal ret = (xmlXPathAxisVal) 0;
    switch (name[0]) {
	case 'a':
	    if (xmlStrEqual(name, BAD_CAST "ancestor"))
		ret = AXIS_ANCESTOR;
	    if (xmlStrEqual(name, BAD_CAST "ancestor-or-self"))
		ret = AXIS_ANCESTOR_OR_SELF;
	    if (xmlStrEqual(name, BAD_CAST "attribute"))
		ret = AXIS_ATTRIBUTE;
	    break;
	case 'c':
	    if (xmlStrEqual(name, BAD_CAST "child"))
		ret = AXIS_CHILD;
	    break;
	case 'd':
	    if (xmlStrEqual(name, BAD_CAST "descendant"))
		ret = AXIS_DESCENDANT;
	    if (xmlStrEqual(name, BAD_CAST "descendant-or-self"))
		ret = AXIS_DESCENDANT_OR_SELF;
	    break;
	case 'f':
	    if (xmlStrEqual(name, BAD_CAST "following"))
		ret = AXIS_FOLLOWING;
	    if (xmlStrEqual(name, BAD_CAST "following-sibling"))
		ret = AXIS_FOLLOWING_SIBLING;
	    break;
	case 'n':
	    if (xmlStrEqual(name, BAD_CAST "namespace"))
		ret = AXIS_NAMESPACE;
	    break;
	case 'p':
	    if (xmlStrEqual(name, BAD_CAST "parent"))
		ret = AXIS_PARENT;
	    if (xmlStrEqual(name, BAD_CAST "preceding"))
		ret = AXIS_PRECEDING;
	    if (xmlStrEqual(name, BAD_CAST "preceding-sibling"))
		ret = AXIS_PRECEDING_SIBLING;
	    break;
	case 's':
	    if (xmlStrEqual(name, BAD_CAST "self"))
		ret = AXIS_SELF;
	    break;
    }
    return(ret);
}